

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

Operand * __thiscall IrSim::newTmpVar(Operand *__return_storage_ptr__,IrSim *this)

{
  int __val;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = this->tmpSeq;
  this->tmpSeq = __val + 1;
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,&this->tmpVarPrefix,&sStack_58);
  Operand::Operand(__return_storage_ptr__,1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

Operand newTmpVar() { return Operand(OP_VARIABLE, tmpVarPrefix + to_string(tmpSeq++)); }